

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

int __thiscall Epoll::Epoll_Add(Epoll *this,SP_channel *_channel,bool accept_flag)

{
  element_type *peVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  __shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  sVar3 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->Mmap)._M_h,
                  &((_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd)
  ;
  if (sVar3 == 0) {
    this_00 = &std::__detail::
               _Map_base<int,_std::pair<const_int,_std::shared_ptr<channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->Mmap,
                            &((_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->fd)->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>);
    peVar1 = (_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (&peVar1->accept_epoll)[!accept_flag] = this;
    epoll_ctl(this->epfd,1,peVar1->fd,(epoll_event *)&peVar1->epevent);
    iVar2 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"the fd is in the epoll list!,Add fail");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Epoll::Epoll_Add(SP_channel _channel,bool accept_flag)
{
    if(Mmap.count(_channel->fd) != 0)
    {
        cout<<"the fd is in the epoll list!,Add fail"<<endl;
        return -1;
    }
    Mmap[_channel->fd] = _channel;
    epoll_event epevent;
    if(accept_flag)
        _channel->accept_epoll = this;
    else
        _channel->attach_epoll = this;
    int flag = epoll_ctl(epfd,EPOLL_CTL_ADD,_channel->fd,&_channel->epevent);
    //cout<<"add fd "<< _channel->fd <<" success!"<<endl;
    return 0;
}